

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelUri.cpp
# Opt level: O1

string * __thiscall
aeron::archive::ChannelUri::toString_abi_cxx11_(string *__return_storage_ptr__,ChannelUri *this)

{
  size_type sVar1;
  ostream *poVar2;
  char *pcVar3;
  size_type sVar4;
  __node_base *p_Var5;
  ostringstream ss;
  char local_1b1;
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar1 = (this->prefix_)._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->prefix_)._M_dataplus._M_p,sVar1);
    if ((this->prefix_)._M_dataplus._M_p[(this->prefix_)._M_string_length - 1] != ':') {
      local_1b1 = ':';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
    }
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(anonymous_namespace)::AERON_PREFIX_abi_cxx11_,
                      DAT_00189750);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->media_)._M_dataplus._M_p,(this->media_)._M_string_length);
  if ((this->params_)._M_h._M_element_count != 0) {
    local_1b1 = '?';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
    sVar4 = (this->params_)._M_h._M_element_count;
    p_Var5 = &(this->params_)._M_h._M_before_begin;
    while( true ) {
      sVar4 = sVar4 - 1;
      p_Var5 = p_Var5->_M_nxt;
      if (p_Var5 == (__node_base *)0x0) break;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)p_Var5[1]._M_nxt,
                          (long)*(_Hash_node_base **)
                                 &((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor);
      local_1b1 = '=';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)p_Var5[5]._M_nxt,(long)p_Var5[6]._M_nxt);
      pcVar3 = "";
      if (sVar4 != 0) {
        pcVar3 = "|";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar3,(ulong)(sVar4 != 0));
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
}

Assistant:

std::string ChannelUri::toString() const {
    std::ostringstream ss;

    if (!prefix_.empty()) {
        ss << prefix_;
        if (':' != *prefix_.rbegin()) {
            ss << ':';
        }
    }

    ss << AERON_PREFIX << media_;

    if (!params_.empty()) {
        ss << '?';

        std::size_t ps = params_.size();

        for (const auto& p : params_) {
            ss << p.first << '=' << p.second << (--ps ? "|" : "");
        }
    }

    return ss.str();
}